

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

void __thiscall
QVLABase<QPushButton_*>::append_impl
          (QVLABase<QPushButton_*> *this,qsizetype prealloc,void *array,QPushButton **abuf,
          qsizetype increment)

{
  size_type sVar1;
  QVLABase<QPushButton_*> *this_00;
  iterator __dest;
  void *in_RCX;
  QVLABase<QPushButton_*> *in_RDX;
  QVLABaseBase *in_RDI;
  void *in_R8;
  qsizetype asize;
  QVLABase<QPushButton_*> *increment_00;
  
  if (0 < (long)in_R8) {
    sVar1 = QVLABaseBase::size(in_RDI);
    this_00 = (QVLABase<QPushButton_*> *)(sVar1 + (long)in_R8);
    increment_00 = this_00;
    sVar1 = QVLABaseBase::capacity(in_RDI);
    if (sVar1 <= (long)this_00) {
      growBy(in_RDX,(qsizetype)in_RCX,in_R8,(qsizetype)increment_00);
    }
    __dest = end(this_00);
    memcpy(__dest,in_RCX,(long)in_R8 << 3);
    in_RDI->s = (qsizetype)increment_00;
  }
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QVLABase<T>::append_impl(qsizetype prealloc, void *array, const T *abuf, qsizetype increment)
{
    Q_ASSERT(abuf || increment == 0);
    if (increment <= 0)
        return;

    const qsizetype asize = size() + increment;

    if (asize >= capacity())
        growBy(prealloc, array, increment);

    if constexpr (QTypeInfo<T>::isComplex)
        std::uninitialized_copy_n(abuf, increment, end());
    else
        memcpy(static_cast<void *>(end()), static_cast<const void *>(abuf), increment * sizeof(T));

    this->s = asize;
}